

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O3

void __thiscall
Engine_testObserveIntegerWithTags_Test::~Engine_testObserveIntegerWithTags_Test
          (Engine_testObserveIntegerWithTags_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Engine, testObserveIntegerWithTags) {
    Engine e("test", std::move(std::make_unique<TestHandler>()));
    e.Observe("histo.value", 3, Tag("foo", "bar"), Tag("another", "tag"));
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->intMeasures.size());
    auto im = th->intMeasures[0];
    ASSERT_EQ("test.histo.value", im.name);
    ASSERT_EQ(MetricType::Histogram, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(3, im.value);
    ASSERT_EQ(2, im.tags.size());
    ASSERT_EQ("foo", im.tags[0].name);
    ASSERT_EQ("bar", im.tags[0].value);
    ASSERT_EQ("another", im.tags[1].name);
    ASSERT_EQ("tag", im.tags[1].value);
}